

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool prvTidySetOptionBool(TidyDocImpl *doc,TidyOptionId optId,Bool val)

{
  if (optId < N_TIDY_OPTIONS) {
    if (option_defs[optId].type != TidyBoolean) {
      __assert_fail("option_defs[ optId ].type == TidyBoolean",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,499,"Bool prvTidySetOptionBool(TidyDocImpl *, TidyOptionId, Bool)");
    }
    SetOptionInteger(doc,optId,(ulong)val);
  }
  return (Bool)(optId < N_TIDY_OPTIONS);
}

Assistant:

Bool TY_(SetOptionBool)( TidyDocImpl* doc, TidyOptionId optId, Bool val )
{
    Bool status = ( optId < N_TIDY_OPTIONS );
    if ( status )
    {
        assert( option_defs[ optId ].type == TidyBoolean );
        SetOptionInteger( doc, optId, (ulong)val );
    }
    return status;
}